

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

arith_uint256 * GetBlockProof(arith_uint256 *__return_storage_ptr__,CBlockIndex *block)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int i;
  long lVar9;
  base_uint<256U> *pbVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined8 uVar12;
  undefined8 uVar13;
  bool fOverflow;
  bool fNegative;
  base_uint<256U> ret;
  arith_uint256 bnTarget;
  bool local_da;
  bool local_d9;
  uint local_d8;
  undefined1 local_d4 [12];
  undefined4 uStack_c8;
  undefined1 auStack_c4 [12];
  base_uint<256U> local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  uint32_t auStack_60 [2];
  base_uint<256U> local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  stack0xffffffffffffff98 = (undefined1  [16])0x0;
  local_78._0_16_ = (undefined1  [16])0x0;
  arith_uint256::SetCompact((arith_uint256 *)local_78,block->nBits,&local_d9,&local_da);
  if ((local_d9 == false) && (local_da == false)) {
    bVar8 = base_uint<256U>::EqualTo((base_uint<256U> *)local_78,0);
    auVar7 = stack0xffffffffffffff98;
    if (!bVar8) {
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      lVar9 = 0;
      do {
        lVar1 = lVar9 * 4;
        uVar3 = *(uint *)(local_78 + lVar1 + 4);
        uVar4 = *(uint *)(local_78 + lVar1 + 8);
        uVar5 = auStack_60[lVar9 + -3];
        lVar2 = lVar9 * 4;
        *(uint *)(local_98 + lVar2) = *(uint *)(local_78 + lVar1) ^ 0xffffffff;
        *(uint *)(local_98 + lVar2 + 4) = uVar3 ^ 0xffffffff;
        *(uint *)(local_98 + lVar2 + 8) = uVar4 ^ 0xffffffff;
        *(uint *)(local_88 + lVar2 + -4) = uVar5 ^ 0xffffffff;
        auVar6 = local_88;
        lVar9 = lVar9 + 4;
      } while (lVar9 != 8);
      local_d8 = 1;
      local_d4 = SUB1612((undefined1  [16])0x0,0);
      uStack_c8 = 0;
      auStack_c4 = SUB1612((undefined1  [16])0x0,4);
      local_58.pn[4] = local_78._16_4_;
      local_58.pn[5] = local_78._20_4_;
      local_58.pn[6] = auStack_60[0];
      local_58.pn[7] = auStack_60[1];
      local_58.pn[0] = local_78._0_4_;
      local_58.pn[1] = local_78._4_4_;
      local_58.pn[2] = local_78._8_4_;
      local_58.pn[3] = local_78._12_4_;
      lVar9 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)*(uint *)(local_d4 + lVar9 * 4 + -4) + local_58.pn[lVar9] + uVar11;
        local_58.pn[lVar9] = (uint32_t)uVar11;
        uVar11 = uVar11 >> 0x20;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      local_b8.pn[1] = local_58.pn[1];
      local_b8.pn[0] = local_58.pn[0];
      local_b8.pn[3] = local_58.pn[3];
      local_b8.pn[2] = local_58.pn[2];
      local_b8.pn[5] = local_58.pn[5];
      local_b8.pn[4] = local_58.pn[4];
      local_b8.pn[6] = local_58.pn[6];
      local_b8.pn[7] = local_58.pn[7];
      local_58.pn[4] = local_88._0_4_;
      local_58.pn[5] = local_88._4_4_;
      local_58.pn[6] = local_88._8_4_;
      local_58.pn[7] = local_88._12_4_;
      local_58.pn[0] = local_98._0_4_;
      local_58.pn[1] = local_98._4_4_;
      local_58.pn[2] = local_98._8_4_;
      local_58.pn[3] = local_98._12_4_;
      local_88 = auVar6;
      unique0x10000725 = auVar7;
      pbVar10 = base_uint<256U>::operator/=(&local_58,&local_b8);
      local_38 = *(undefined8 *)pbVar10->pn;
      uStack_30 = *(undefined8 *)(pbVar10->pn + 2);
      local_28 = *(undefined8 *)(pbVar10->pn + 4);
      uStack_20 = *(undefined8 *)(pbVar10->pn + 6);
      local_58.pn[0] = 1;
      local_58.pn[1] = 0;
      local_58.pn[2] = 0;
      local_58.pn[3] = 0;
      local_58.pn[4] = 0;
      local_58.pn[5] = 0;
      local_58.pn[6] = 0;
      local_58.pn[7] = 0;
      lVar9 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)local_58.pn[lVar9] + *(uint *)((long)&local_38 + lVar9 * 4) + uVar11;
        *(int *)((long)&local_38 + lVar9 * 4) = (int)uVar11;
        uVar11 = uVar11 >> 0x20;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 4) = local_28;
      *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 6) = uStack_20;
      uVar12 = local_38;
      uVar13 = uStack_30;
      goto LAB_00468fd4;
    }
  }
  (__return_storage_ptr__->super_base_uint<256U>).pn[4] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[5] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[6] = 0;
  (__return_storage_ptr__->super_base_uint<256U>).pn[7] = 0;
  uVar12 = 0;
  uVar13 = 0;
LAB_00468fd4:
  *(undefined8 *)(__return_storage_ptr__->super_base_uint<256U>).pn = uVar12;
  *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 2) = uVar13;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 GetBlockProof(const CBlockIndex& block)
{
    arith_uint256 bnTarget;
    bool fNegative;
    bool fOverflow;
    bnTarget.SetCompact(block.nBits, &fNegative, &fOverflow);
    if (fNegative || fOverflow || bnTarget == 0)
        return 0;
    // We need to compute 2**256 / (bnTarget+1), but we can't represent 2**256
    // as it's too large for an arith_uint256. However, as 2**256 is at least as large
    // as bnTarget+1, it is equal to ((2**256 - bnTarget - 1) / (bnTarget+1)) + 1,
    // or ~bnTarget / (bnTarget+1) + 1.
    return (~bnTarget / (bnTarget + 1)) + 1;
}